

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Translator * __thiscall
helics::Federate::registerTranslator
          (Federate *this,int32_t translatorType,string_view translatorName,string_view endpointType
          ,string_view units)

{
  string_view addition;
  Translator *pTVar1;
  Time in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  undefined1 in_stack_00000048 [16];
  string_view in_stack_00000060;
  Translator *trans;
  int32_t type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  Translator *this_00;
  Federate *this_01;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  
  this_01 = (Federate *)&stack0x00000008;
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator->((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                *)0x219b69);
  addition._M_str = in_stack_ffffffffffffff58;
  addition._M_len = in_stack_ffffffffffffff50;
  localNameGenerator_abi_cxx11_(this_01,addition);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
  type = (int32_t)((ulong)this_01->_vptr_Federate >> 0x20);
  this_00 = *(Translator **)&this_01->currentMode;
  pTVar1 = ConnectorFederateManager::registerTranslator
                     ((ConnectorFederateManager *)in_stack_00000030.internalTimeCode,
                      (string_view)in_stack_00000048,(string_view)in_stack_00000038,
                      in_stack_00000060);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  Translator::setTranslatorType(this_00,type);
  return pTVar1;
}

Assistant:

Translator& Federate::registerTranslator(std::int32_t translatorType,
                                         std::string_view translatorName,
                                         std::string_view endpointType,
                                         std::string_view units)
{
    Translator& trans =
        cManager->registerTranslator(localNameGenerator(translatorName), endpointType, units);
    trans.setTranslatorType(translatorType);
    return trans;
}